

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O3

Var Js::JavascriptNumber::EntryToString(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  code *pcVar2;
  double dVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  Var pvVar8;
  JavascriptString *pJVar9;
  RecyclableObject *pRVar10;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  char *fileName;
  ScriptContext *pSVar14;
  int in_stack_00000010;
  Type local_70;
  Type TStack_68;
  CallInfo local_60;
  CallInfo callInfo_local;
  Var result;
  double value;
  undefined1 auStack_40 [8];
  ArgumentReader args;
  
  pSVar14 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr;
  local_60 = callInfo;
  ThreadContext::ProbeStack(pSVar14->threadContext,0xc00,pSVar14,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x33b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00cdcdfc;
    *puVar7 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  auStack_40 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)auStack_40,&local_60);
  pSVar14 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr;
  if (((ulong)local_60 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x33e,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00cdcdfc;
    *puVar7 = 0;
  }
  if (((ulong)auStack_40 & 0xffffff) == 0) goto LAB_00cdcde8;
  pvVar8 = Arguments::operator[]((Arguments *)auStack_40,0);
  if (((ulong)pvVar8 & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) goto LAB_00cdc77b;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00cdcdfc;
    *puVar7 = 0;
LAB_00cdc77b:
    if ((auStack_40._0_4_ & 0xffffff) == 1) goto LAB_00cdc8ec;
    pvVar8 = Arguments::operator[]((Arguments *)auStack_40,1);
    if (((ulong)pvVar8 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) goto LAB_00cdc907;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00cdcdfc;
      *puVar7 = 0;
    }
    pvVar8 = Arguments::operator[]((Arguments *)auStack_40,1);
    if (((ulong)pvVar8 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        value = (double)pSVar14;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar12 = "(Is(aValue))";
        pcVar11 = "Ensure var is actually a \'TaggedInt\'";
        uVar13 = 0x43;
        goto LAB_00cdc8ce;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      value = (double)pSVar14;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      pcVar12 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar11 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar13 = 0x2a;
LAB_00cdc8ce:
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,uVar13,pcVar12,pcVar11);
      if (!bVar4) goto LAB_00cdcdfc;
      *puVar7 = 0;
      pSVar14 = (ScriptContext *)value;
    }
    if ((int)pvVar8 == 10) {
LAB_00cdc8ec:
      pvVar8 = Arguments::operator[]((Arguments *)auStack_40,0);
      pJVar9 = ScriptContext::GetIntegerString(pSVar14,pvVar8);
      return pJVar9;
    }
  }
LAB_00cdc907:
  pvVar8 = Arguments::operator[]((Arguments *)auStack_40,0);
  BVar5 = GetThisValue(pvVar8,(double *)&result);
  if (BVar5 != 0) {
    if (((ulong)auStack_40 & 0xfffffe) == 0) goto LAB_00cdcd09;
    pvVar8 = Arguments::operator[]((Arguments *)auStack_40,1);
    if (((ulong)pvVar8 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) goto LAB_00cdca10;
      if (pvVar8 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_00cdcdfc;
        *puVar7 = 0;
LAB_00cdcc0f:
        pRVar10 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
        if (pRVar10 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar4) goto LAB_00cdcdfc;
          *puVar7 = 0;
        }
        TVar1 = ((pRVar10->type).ptr)->typeId;
        if ((int)TVar1 < 0x58) {
          if (TVar1 == TypeIds_Undefined) goto LAB_00cdcd09;
        }
        else {
          BVar5 = RecyclableObject::IsExternal(pRVar10);
          if (BVar5 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar7 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar4) goto LAB_00cdcdfc;
            *puVar7 = 0;
          }
        }
      }
      else if ((ulong)pvVar8 >> 0x32 == 0) goto LAB_00cdcc0f;
      dVar3 = JavascriptConversion::ToInteger_Full(pvVar8,pSVar14);
      pvVar8 = (Var)(ulong)(uint)(int)dVar3;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00cdcdfc;
      *puVar7 = 0;
LAB_00cdca10:
      if (((ulong)pvVar8 & 0x1ffff00000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar4) goto LAB_00cdcdfc;
        *puVar7 = 0;
      }
    }
    iVar6 = (int)pvVar8;
    if (iVar6 != 10) {
      if (0xffffffdc < iVar6 - 0x25U) {
        pJVar9 = ToStringRadixHelper((double)result,iVar6,pSVar14);
        return pJVar9;
      }
      JavascriptError::ThrowRangeError(pSVar14,-0x7ff5ec37,L"Number.prototype.toString");
    }
LAB_00cdcd09:
    pJVar9 = ToStringRadix10((double)result,pSVar14);
    return pJVar9;
  }
  pvVar8 = Arguments::operator[]((Arguments *)auStack_40,0);
  if (pvVar8 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00cdcdfc;
    *puVar7 = 0;
LAB_00cdcad4:
    pRVar10 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
    if (pRVar10 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00cdcdfc;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar10->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_HostDispatch) {
        pvVar8 = Arguments::operator[]((Arguments *)auStack_40,0);
        pRVar10 = VarTo<Js::RecyclableObject>(pvVar8);
        local_70._0_4_ = auStack_40._0_4_;
        local_70._4_4_ = auStack_40._4_4_;
        TStack_68._0_4_ = args.super_Arguments.Info._0_4_;
        TStack_68._4_4_ = args.super_Arguments.Info._4_4_;
        iVar6 = (*(pRVar10->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x55])
                          (pRVar10,EntryToString,&local_70,&callInfo_local);
        if (iVar6 != 0) {
          return (Var)callInfo_local;
        }
      }
      goto LAB_00cdcde8;
    }
    BVar5 = RecyclableObject::IsExternal(pRVar10);
    if (BVar5 != 0) goto LAB_00cdcde8;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
    ;
    pcVar12 = "(typeId < TypeIds_Limit || obj->IsExternal())";
    pcVar11 = "GetTypeId aValue has invalid TypeId";
    uVar13 = 0xe;
  }
  else {
    if (((ulong)pvVar8 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar8 >> 0x32 != 0) || (((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000))
      goto LAB_00cdcde8;
      goto LAB_00cdcad4;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    pcVar12 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar11 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar13 = 0x2a;
  }
  bVar4 = Throw::ReportAssert(fileName,uVar13,pcVar12,pcVar11);
  if (!bVar4) {
LAB_00cdcdfc:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar7 = 0;
LAB_00cdcde8:
  JavascriptError::ThrowTypeError(pSVar14,-0x7ff5ec3c,L"Number.prototype.toString");
}

Assistant:

Var JavascriptNumber::EntryToString(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toString"));
        }

        // Optimize base 10 of TaggedInt numbers
        if (TaggedInt::Is(args[0]) && (args.Info.Count == 1 || (TaggedInt::Is(args[1]) && TaggedInt::ToInt32(args[1]) == 10)))
        {
            return scriptContext->GetIntegerString(args[0]);
        }

        double value;
        if (!GetThisValue(args[0], &value))
        {
            if (JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)
            {
                Var result;
                if (VarTo<RecyclableObject>(args[0])->InvokeBuiltInOperationRemotely(EntryToString, args, &result))
                {
                    return result;
                }
            }

            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toString"));
        }

        int radix = 10;
        if(args.Info.Count > 1)
        {
            //use the first arg as the radix, ignore the rest.
            Var aRadix = args[1];

           // shortcut for tagged int's
            if(TaggedInt::Is(aRadix))
            {
                radix = TaggedInt::ToInt32(aRadix);
            }
            else if(JavascriptOperators::GetTypeId(aRadix) != TypeIds_Undefined)
            {
                radix = (int)JavascriptConversion::ToInteger(aRadix,scriptContext);
            }

        }
        if(10 == radix)
        {
            return ToStringRadix10(value, scriptContext);
        }

        if( radix < 2 || radix >36 )
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_FunctionArgument_Invalid, _u("Number.prototype.toString"));
        }

        return ToStringRadixHelper(value, radix, scriptContext);
    }